

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O3

void __thiscall
lsim::SimCircuit::write_output_pins(SimCircuit *this,uint32_t comp_id,value_container_t *values)

{
  SimComponent *this_00;
  pointer pVVar1;
  iterator iVar2;
  pointer pVVar3;
  ulong uVar4;
  uint uVar5;
  uint32_t local_1c;
  
  local_1c = comp_id;
  iVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_lsim::SimComponent_*>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_components)._M_h,&local_1c);
  if ((iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>.
       _M_cur != (__node_type *)0x0) &&
     (this_00 = *(SimComponent **)
                 ((long)iVar2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>
                        ._M_cur + 0x10), this_00 != (SimComponent *)0x0)) {
    pVVar3 = (values->super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pVVar1 = (values->super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pVVar1 - (long)pVVar3 >> 2 ==
        (ulong)(this_00->m_control_start - this_00->m_output_start)) {
      if (pVVar1 != pVVar3) {
        uVar5 = 1;
        uVar4 = 0;
        do {
          SimComponent::set_user_value(this_00,(uVar5 + this_00->m_output_start) - 1,pVVar3[uVar4]);
          uVar4 = (ulong)uVar5;
          pVVar3 = (values->super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar5 = uVar5 + 1;
        } while (uVar4 < (ulong)((long)(values->
                                       super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >>
                                2));
      }
      return;
    }
    __assert_fail("values.size() == comp->num_outputs()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                  ,0x97,"void lsim::SimCircuit::write_output_pins(uint32_t, value_container_t)");
  }
  __assert_fail("comp",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0x95,"void lsim::SimCircuit::write_output_pins(uint32_t, value_container_t)");
}

Assistant:

void SimCircuit::write_output_pins(uint32_t comp_id, value_container_t values) {
    auto comp = component_by_id(comp_id);
    assert(comp);

    assert(values.size() == comp->num_outputs());

    for (auto idx = 0u; idx < values.size(); ++idx) {
        comp->set_user_value(comp->output_pin_index(idx), values[idx]);
    }
}